

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_queue.c
# Opt level: O2

void ItemQueue_add(ItemQueue *item_queue,Item *item)

{
  QueueItem *pQVar1;
  
  pQVar1 = (QueueItem *)malloc(0x10);
  pQVar1->item = item;
  pQVar1->next = (QueueItem *)0x0;
  if (item_queue->first == (QueueItem *)0x0) {
    item_queue->first = pQVar1;
  }
  else {
    item_queue->last->next = pQVar1;
  }
  item_queue->last = pQVar1;
  return;
}

Assistant:

void ItemQueue_add(ItemQueue* item_queue, Item* item) {
    QueueItem* queue_item = (QueueItem*)malloc(sizeof(QueueItem));
    queue_item->item = item;
    queue_item->next = 0;
    add(item_queue, queue_item);
}